

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

int lys_has_xpath(lys_node *node)

{
  uint8_t uVar1;
  LYS_NODE LVar2;
  long lVar3;
  
  if (node == (lys_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0xd94,"int lys_has_xpath(const struct lys_node *)");
  }
  LVar2 = node->nodetype;
  if ((int)LVar2 < 0x80) {
    switch(LVar2) {
    case LYS_CONTAINER:
      if (node[1].name != (char *)0x0) {
        return 1;
      }
      goto LAB_00161e82;
    case LYS_CHOICE|LYS_CONTAINER:
    case LYS_LEAF|LYS_CONTAINER:
    case LYS_LEAF|LYS_CHOICE:
    case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
      return 0;
    case LYS_LEAF:
    case LYS_LEAFLIST:
switchD_00161e52_caseD_4:
      if (node[1].name != (char *)0x0) {
        return 1;
      }
      uVar1 = node->padding[3];
      goto joined_r0x00161ebd;
    default:
      if (LVar2 == LYS_LIST) {
        if (node[1].name != (char *)0x0) {
          return 1;
        }
        if (node->padding[0] == '\0') {
          return 0;
        }
        return 1;
      }
      if (LVar2 != LYS_CASE) {
        return 0;
      }
    case LYS_CHOICE:
switchD_00161e52_caseD_2:
      lVar3._0_1_ = node->hash[0];
      lVar3._1_1_ = node->hash[1];
      lVar3._2_1_ = node->hash[2];
      lVar3._3_1_ = node->hash[3];
      lVar3._4_4_ = *(undefined4 *)&node->field_0x6c;
      if (lVar3 == 0) {
        return 0;
      }
    }
  }
  else {
    if (0xfff < (int)LVar2) {
      if (LVar2 != LYS_USES) {
        if (LVar2 != LYS_ANYDATA) {
          if (LVar2 != LYS_AUGMENT) {
            return 0;
          }
          if (node->next == (lys_node *)0x0) {
            return 0;
          }
          return 1;
        }
        goto switchD_00161e52_caseD_4;
      }
      goto switchD_00161e52_caseD_2;
    }
    if (((LVar2 != LYS_NOTIF) && (LVar2 != LYS_INPUT)) && (LVar2 != LYS_OUTPUT)) {
      return 0;
    }
LAB_00161e82:
    uVar1 = node->padding[1];
joined_r0x00161ebd:
    if (uVar1 == '\0') {
      return 0;
    }
  }
  return 1;
}

Assistant:

int
lys_has_xpath(const struct lys_node *node)
{
    assert(node);

    switch (node->nodetype) {
    case LYS_AUGMENT:
        if (((struct lys_node_augment *)node)->when) {
            return 1;
        }
        break;
    case LYS_CASE:
        if (((struct lys_node_case *)node)->when) {
            return 1;
        }
        break;
    case LYS_CHOICE:
        if (((struct lys_node_choice *)node)->when) {
            return 1;
        }
        break;
    case LYS_ANYDATA:
        if (((struct lys_node_anydata *)node)->when || ((struct lys_node_anydata *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_LEAF:
        if (((struct lys_node_leaf *)node)->when || ((struct lys_node_leaf *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_LEAFLIST:
        if (((struct lys_node_leaflist *)node)->when || ((struct lys_node_leaflist *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_LIST:
        if (((struct lys_node_list *)node)->when || ((struct lys_node_list *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_CONTAINER:
        if (((struct lys_node_container *)node)->when || ((struct lys_node_container *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        if (((struct lys_node_inout *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_NOTIF:
        if (((struct lys_node_notif *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_USES:
        if (((struct lys_node_uses *)node)->when) {
            return 1;
        }
        break;
    default:
        /* does not have XPath */
        break;
    }

    return 0;
}